

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O3

gravity_object_t * gravity_class_lookup(gravity_class_t *c,gravity_value_t key)

{
  gravity_value_t *pgVar1;
  
  if (c != (gravity_class_t *)0x0) {
    do {
      pgVar1 = gravity_hash_lookup(c->htable,key);
      if (pgVar1 != (gravity_value_t *)0x0) {
        return (gravity_object_t *)(pgVar1->field_1).n;
      }
      c = c->superclass;
    } while (c != (gravity_class_s *)0x0);
  }
  return (gravity_object_t *)0x0;
}

Assistant:

inline gravity_object_t *gravity_class_lookup (gravity_class_t *c, gravity_value_t key) {
    while (c) {
        gravity_value_t *v = gravity_hash_lookup(c->htable, key);
        if (v) return (gravity_object_t *)v->p;
        c = c->superclass;
    }
    return NULL;
}